

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sfp.c
# Opt level: O0

int csp_sfp_send_own_memcpy
              (csp_conn_t *conn,void *data,uint totalsize,uint mtu,uint32_t timeout,
              csp_memcpy_fnc_t memcpyfcn)

{
  _Bool _Var1;
  __uint32_t _Var2;
  csp_packet_t *packet_00;
  sfp_header_t *psVar3;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  code *in_R9;
  uint size;
  csp_packet_t *packet;
  sfp_header_t *sfp_header;
  uint count;
  csp_packet_t *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint uVar4;
  uint local_34;
  int local_4;
  
  if ((in_ECX == 0) || (0x100 < (ulong)in_ECX + 8)) {
    local_4 = -2;
  }
  else {
    local_34 = 0;
    while( true ) {
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 & 0xffffff;
      if (local_34 < in_EDX) {
        _Var1 = csp_conn_is_active((csp_conn_t *)in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffb0 = CONCAT13(_Var1,(int3)in_stack_ffffffffffffffb0);
      }
      if ((char)(in_stack_ffffffffffffffb0 >> 0x18) == '\0') {
        return 0;
      }
      packet_00 = csp_buffer_get(0x10be70);
      if (packet_00 == (csp_packet_t *)0x0) break;
      uVar4 = in_EDX - local_34;
      if (in_ECX < in_EDX - local_34) {
        uVar4 = in_ECX;
      }
      (*in_R9)(&packet_00->field_5,in_RSI + (ulong)local_34,uVar4);
      packet_00->length = (uint16_t)uVar4;
      *(byte *)(in_RDI + 0x11) = *(byte *)(in_RDI + 0x11) | 0x10;
      psVar3 = csp_sfp_header_add(packet_00);
      _Var2 = __bswap_32(in_EDX);
      psVar3->totalsize = _Var2;
      _Var2 = __bswap_32(local_34);
      psVar3->offset = _Var2;
      csp_send((csp_conn_t *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
      local_34 = uVar4 + local_34;
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int csp_sfp_send_own_memcpy(csp_conn_t * conn, const void * data, unsigned int totalsize, unsigned int mtu, uint32_t timeout, csp_memcpy_fnc_t memcpyfcn) {
	if (mtu == 0 || mtu + sizeof(sfp_header_t) > CSP_BUFFER_SIZE) {
		return CSP_ERR_INVAL;
	}

	unsigned int count = 0;
	while ((count < totalsize) && csp_conn_is_active(conn)) {

		sfp_header_t * sfp_header;

		/* Allocate packet */
		csp_packet_t * packet = csp_buffer_get(0);
		if (packet == NULL) {
			return CSP_ERR_NOMEM;
		}

		/* Calculate sending size */
		unsigned int size = totalsize - count;
		if (size > mtu) {
			size = mtu;
		}

		/* Print debug */
		//csp_print("%s: %d:%d, sending at %p size %u\n", __func__, csp_conn_src(conn), csp_conn_sport(conn), (void *)((uint8_t *)data + count), size);

		/* Copy data */
		(memcpyfcn)((csp_memptr_t)(uintptr_t)packet->data, (csp_memptr_t)(uintptr_t)(((uint8_t *)data) + count), size);
		packet->length = size;

		/* Set fragment flag */
		conn->idout.flags |= CSP_FFRAG;

		/* Add SFP header */
		sfp_header = csp_sfp_header_add(packet);
		sfp_header->totalsize = htobe32(totalsize);
		sfp_header->offset = htobe32(count);

		/* Send data */
		csp_send(conn, packet);

		/* Increment count */
		count += size;
	}

	return CSP_ERR_NONE;
}